

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyper_log_log.hxx
# Opt level: O0

uint32_t hll::hyper_log_log<int,_12UL>::count_bits(hash_result value)

{
  undefined4 local_14;
  undefined4 local_10;
  uint32_t c;
  hash_result value_local;
  
  if ((value & 1) == 1) {
    c = 0;
  }
  else {
    local_14 = 1;
    local_10 = value;
    if ((value & 0xffff) == 0) {
      local_10 = value >> 0x10;
      local_14 = 0x11;
    }
    if ((local_10 & 0xff) == 0) {
      local_10 = local_10 >> 8;
      local_14 = local_14 + 8;
    }
    if ((local_10 & 0xf) == 0) {
      local_10 = local_10 >> 4;
      local_14 = local_14 + 4;
    }
    if ((local_10 & 3) == 0) {
      local_10 = local_10 >> 2;
      local_14 = local_14 + 2;
    }
    c = local_14 - (local_10 & 1);
  }
  return c;
}

Assistant:

HLL_CONSTEXPR_OR_INLINE uint32_t hyper_log_log<T, k>::count_bits(hash_result value) noexcept
{
    if ((value & 1u) == 1)
        return 0;

    uint32_t c = 1;
    if ((value & 0xffffu) == 0)
    {
        value >>= 16u;
        c += 16;
    }
    if ((value & 0xffu) == 0)
    {
        value >>= 8u;
        c += 8;
    }
    if ((value & 0xfu) == 0)
    {
        value >>= 4u;
        c += 4;
    }
    if ((value & 0x3u) == 0)
    {
        value >>= 2u;
        c += 2;
    }
    c -= value & 0x1u;

    return c;
}